

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O2

void __thiscall sf::RenderTarget::applyTransform(RenderTarget *this,Transform *transform)

{
  bool bVar1;
  float *pfVar2;
  
  bVar1 = operator==(transform,(Transform *)Transform::Identity);
  if (bVar1) {
    glLoadIdentity();
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTarget.cpp"
                       ,0x276,"glLoadIdentity()");
    return;
  }
  pfVar2 = Transform::getMatrix(transform);
  glLoadMatrixf(pfVar2);
  priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTarget.cpp"
                     ,0x278,"glLoadMatrixf(transform.getMatrix())");
  return;
}

Assistant:

void RenderTarget::applyTransform(const Transform& transform)
{
    // No need to call glMatrixMode(GL_MODELVIEW), it is always the
    // current mode (for optimization purpose, since it's the most used)
    if (transform == Transform::Identity)
        glCheck(glLoadIdentity());
    else
        glCheck(glLoadMatrixf(transform.getMatrix()));
}